

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O1

void __thiscall QThread::setPriority(QThread *this,Priority priority)

{
  __base_type copy;
  QThreadPrivate *this_00;
  QMutex *this_01;
  long in_FS_OFFSET;
  bool bVar1;
  QMessageLogger local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (priority == InheritPriority) {
    setPriority();
    goto LAB_003476d7;
  }
  this_00 = (QThreadPrivate *)(this->super_QObject).d_ptr.d;
  this_01 = &this_00->mutex;
  if ((this_00->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar1 = (this_01->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar1) {
      (this_01->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (!bVar1) goto LAB_00347674;
  }
  else {
LAB_00347674:
    QBasicMutex::lockInternal(&this_01->super_QBasicMutex);
  }
  if (this_00->threadState == Running) {
    QThreadPrivate::setPriority(this_00,priority);
  }
  else {
    local_40.context.version = 2;
    local_40.context._4_8_ = 0;
    local_40.context._12_8_ = 0;
    local_40.context.function._4_4_ = 0;
    local_40.context.category = "default";
    QMessageLogger::warning
              (&local_40,"QThread::setPriority: Cannot set priority, thread is not running");
  }
  LOCK();
  copy._M_p = (this_01->super_QBasicMutex).d_ptr._q_value._M_b._M_p;
  (this_01->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (copy._M_p != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(&this_01->super_QBasicMutex,copy._M_p);
  }
LAB_003476d7:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QThread::setPriority(Priority priority)
{
    if (priority == QThread::InheritPriority) {
        qWarning("QThread::setPriority: Argument cannot be InheritPriority");
        return;
    }
    Q_D(QThread);
    QMutexLocker locker(&d->mutex);
    if (d->threadState != QThreadPrivate::Running) {
        qWarning("QThread::setPriority: Cannot set priority, thread is not running");
        return;
    }
    d->setPriority(priority);
}